

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

void free_Folder(_7z_folder *f)

{
  ulong *in_RDI;
  uint i;
  uint local_c;
  
  if (in_RDI[1] != 0) {
    for (local_c = 0; (ulong)local_c < *in_RDI; local_c = local_c + 1) {
      free(*(void **)(in_RDI[1] + (ulong)local_c * 0x28 + 0x20));
    }
    free((void *)in_RDI[1]);
  }
  free((void *)in_RDI[3]);
  free((void *)in_RDI[5]);
  free((void *)in_RDI[8]);
  return;
}

Assistant:

static void
free_Folder(struct _7z_folder *f)
{
	unsigned i;

	if (f->coders) {
		for (i = 0; i< f->numCoders; i++) {
			free(f->coders[i].properties);
		}
		free(f->coders);
	}
	free(f->bindPairs);
	free(f->packedStreams);
	free(f->unPackSize);
}